

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# water.cpp
# Opt level: O0

shared_ptr<Image> runWaterEffect(Image *src,WaterEffectOptions *options)

{
  bool bVar1;
  ostream *poVar2;
  runtime_error *this;
  long in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  WaterEffectOptions *in_RDI;
  double dVar3;
  shared_ptr<Image> sVar4;
  shared_ptr<Histogram> hist;
  Timer ts;
  shared_ptr<Image> *img_result;
  shared_ptr<Histogram> *in_stack_fffffffffffffe98;
  Timer *in_stack_fffffffffffffea0;
  WaterEffectOptions *in_stack_ffffffffffffff10;
  Image *in_stack_ffffffffffffff18;
  WaterEffectOptions *previous;
  WaterEffectOptions *in_stack_ffffffffffffff50;
  Image *in_stack_ffffffffffffff58;
  WaterEffectOptions *in_stack_ffffffffffffffc8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_ffffffffffffffd0;
  Image *in_stack_ffffffffffffffd8;
  
  previous = in_RDI;
  Timer::Timer(in_stack_fffffffffffffea0);
  std::shared_ptr<Histogram>::shared_ptr((shared_ptr<Histogram> *)0x12025c);
  std::shared_ptr<Image>::shared_ptr((shared_ptr<Image> *)0x120271);
  if ((*(byte *)(in_RDX + 0x28) & 1) != 0) {
    Timer::start(in_stack_fffffffffffffea0);
    runHistogramStage((Image *)previous,in_RDI);
    std::shared_ptr<Histogram>::operator=
              ((shared_ptr<Histogram> *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    std::shared_ptr<Histogram>::~shared_ptr((shared_ptr<Histogram> *)0x1202db);
    Timer::stop(in_stack_fffffffffffffea0);
    poVar2 = std::operator<<((ostream *)&std::cout,"Stage: Histogram:        ");
    dVar3 = Timer::seconds(in_stack_fffffffffffffea0);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,dVar3);
    in_stack_ffffffffffffff18 = (Image *)std::operator<<(poVar2," s.");
    std::ostream::operator<<(in_stack_ffffffffffffff18,std::endl<char,std::char_traits<char>>);
  }
  if ((*(byte *)(in_RDX + 0x29) & 1) != 0) {
    Timer::start(in_stack_fffffffffffffea0);
    bVar1 = std::operator==((shared_ptr<Histogram> *)in_stack_fffffffffffffea0,
                            in_stack_fffffffffffffe98);
    if (bVar1) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"Cannot run enhance stage without histogram.");
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__shared_ptr<Histogram,_(__gnu_cxx::_Lock_policy)2>::get
              ((__shared_ptr<Histogram,_(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc8);
    runEnhanceStage(in_stack_ffffffffffffffd8,(Histogram *)in_stack_ffffffffffffffd0._M_pi,
                    in_stack_ffffffffffffffc8);
    std::shared_ptr<Image>::operator=
              ((shared_ptr<Image> *)in_stack_fffffffffffffea0,
               (shared_ptr<Image> *)in_stack_fffffffffffffe98);
    std::shared_ptr<Image>::~shared_ptr((shared_ptr<Image> *)0x120486);
    Timer::stop(in_stack_fffffffffffffea0);
    poVar2 = std::operator<<((ostream *)&std::cout,"Stage: Contrast enhance: ");
    dVar3 = Timer::seconds(in_stack_fffffffffffffea0);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,dVar3);
    poVar2 = std::operator<<(poVar2," s.");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  if ((*(byte *)(in_RDX + 0x2b) & 1) != 0) {
    Timer::start(in_stack_fffffffffffffea0);
    bVar1 = std::operator==((shared_ptr<Image> *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98
                           );
    if (bVar1) {
      runRippleStage(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
      std::shared_ptr<Image>::operator=
                ((shared_ptr<Image> *)in_stack_fffffffffffffea0,
                 (shared_ptr<Image> *)in_stack_fffffffffffffe98);
      std::shared_ptr<Image>::~shared_ptr((shared_ptr<Image> *)0x120581);
    }
    else {
      std::__shared_ptr<Image,_(__gnu_cxx::_Lock_policy)2>::get
                ((__shared_ptr<Image,_(__gnu_cxx::_Lock_policy)2> *)previous);
      runRippleStage(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
      std::shared_ptr<Image>::operator=
                ((shared_ptr<Image> *)in_stack_fffffffffffffea0,
                 (shared_ptr<Image> *)in_stack_fffffffffffffe98);
      std::shared_ptr<Image>::~shared_ptr((shared_ptr<Image> *)0x1205cc);
    }
    Timer::stop(in_stack_fffffffffffffea0);
    poVar2 = std::operator<<((ostream *)&std::cout,"Stage: Ripple effect:    ");
    dVar3 = Timer::seconds(in_stack_fffffffffffffea0);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,dVar3);
    poVar2 = std::operator<<(poVar2," s.");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  if ((*(byte *)(in_RDX + 0x20) & 1) != 0) {
    Timer::start(in_stack_fffffffffffffea0);
    bVar1 = std::operator==((shared_ptr<Image> *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98
                           );
    if (bVar1) {
      runBlurStage(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
      std::shared_ptr<Image>::operator=
                ((shared_ptr<Image> *)in_stack_fffffffffffffea0,
                 (shared_ptr<Image> *)in_stack_fffffffffffffe98);
      std::shared_ptr<Image>::~shared_ptr((shared_ptr<Image> *)0x1206c7);
    }
    else {
      std::__shared_ptr<Image,_(__gnu_cxx::_Lock_policy)2>::get
                ((__shared_ptr<Image,_(__gnu_cxx::_Lock_policy)2> *)previous);
      runBlurStage(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
      std::shared_ptr<Image>::operator=
                ((shared_ptr<Image> *)in_stack_fffffffffffffea0,
                 (shared_ptr<Image> *)in_stack_fffffffffffffe98);
      std::shared_ptr<Image>::~shared_ptr((shared_ptr<Image> *)0x120712);
    }
    Timer::stop(in_stack_fffffffffffffea0);
    poVar2 = std::operator<<((ostream *)&std::cout,"Stage: Blur:             ");
    dVar3 = Timer::seconds(in_stack_fffffffffffffea0);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,dVar3);
    poVar2 = std::operator<<(poVar2," s.");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  std::shared_ptr<Histogram>::~shared_ptr((shared_ptr<Histogram> *)0x1207c0);
  sVar4.super___shared_ptr<Image,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = extraout_RDX._M_pi
  ;
  sVar4.super___shared_ptr<Image,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)in_RDI;
  return (shared_ptr<Image>)sVar4.super___shared_ptr<Image,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Image> runWaterEffect(const Image *src, const WaterEffectOptions *options) {
  // Stage timer
  Timer ts;

  // Smart pointers to intermediate images:
  std::shared_ptr<Histogram> hist;
  std::shared_ptr<Image> img_result;

  // Histogram stage
  if (options->histogram) {
    ts.start();
    hist = runHistogramStage(src, options);
    ts.stop();
    std::cout << "Stage: Histogram:        " << ts.seconds() << " s." << std::endl;
  }

  // Contrast enhancement stage
  if (options->enhance) {
    ts.start();
    if (hist == nullptr) {
      throw std::runtime_error("Cannot run enhance stage without histogram.");
    }
    img_result = runEnhanceStage(src, hist.get(), options);
    ts.stop();
    std::cout << "Stage: Contrast enhance: " << ts.seconds() << " s." << std::endl;
  }

  // Ripple effect stage
  if (options->ripple) {
    ts.start();
    if (img_result == nullptr) {
      img_result = runRippleStage(src, options);
    } else {
      img_result = runRippleStage(img_result.get(), options);
    }
    ts.stop();
    std::cout << "Stage: Ripple effect:    " << ts.seconds() << " s." << std::endl;
  }

  // Gaussian blur stage
  if (options->blur) {
    ts.start();
    if (img_result == nullptr) {
      img_result = runBlurStage(src, options);
    } else {
      img_result = runBlurStage(img_result.get(), options);
    }
    ts.stop();
    std::cout << "Stage: Blur:             " << ts.seconds() << " s." << std::endl;
  }

  return img_result;
}